

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRulePlaceholderExpander.cxx
# Opt level: O2

void __thiscall
cmRulePlaceholderExpander::ExpandRuleVariables
          (cmRulePlaceholderExpander *this,cmOutputConverter *outputConverter,string *s,
          RuleVariables *replaceValues)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  char cVar4;
  string var;
  string expandedInput;
  string local_70 [32];
  string replace;
  
  cVar4 = (char)s;
  uVar2 = std::__cxx11::string::find(cVar4,0x3c);
  if (uVar2 != 0xffffffffffffffff) {
    expandedInput._M_dataplus._M_p = (pointer)&expandedInput.field_2;
    expandedInput._M_string_length = 0;
    expandedInput.field_2._M_local_buf[0] = '\0';
    while ((uVar2 != 0xffffffffffffffff && (uVar2 < s->_M_string_length - 2))) {
      lVar3 = std::__cxx11::string::find(cVar4,0x3e);
      if (lVar3 == -1) goto LAB_00279767;
      iVar1 = isalpha((int)(s->_M_dataplus)._M_p[uVar2 + 1]);
      if (iVar1 == 0) {
        uVar2 = std::__cxx11::string::find(cVar4,0x3c);
      }
      else {
        std::__cxx11::string::substr((ulong)&var,(ulong)s);
        ExpandRuleVariable(&replace,this,outputConverter,&var,replaceValues);
        std::__cxx11::string::substr((ulong)local_70,(ulong)s);
        std::__cxx11::string::append((string *)&expandedInput);
        std::__cxx11::string::~string(local_70);
        std::__cxx11::string::append((string *)&expandedInput);
        uVar2 = std::__cxx11::string::find(cVar4,0x3c);
        std::__cxx11::string::~string((string *)&replace);
        std::__cxx11::string::~string((string *)&var);
      }
    }
    std::__cxx11::string::substr((ulong)&var,(ulong)s);
    std::__cxx11::string::append((string *)&expandedInput);
    std::__cxx11::string::~string((string *)&var);
    std::__cxx11::string::_M_assign((string *)s);
LAB_00279767:
    std::__cxx11::string::~string((string *)&expandedInput);
  }
  return;
}

Assistant:

void cmRulePlaceholderExpander::ExpandRuleVariables(
  cmOutputConverter* outputConverter, std::string& s,
  const RuleVariables& replaceValues)
{
  std::string::size_type start = s.find('<');
  // no variables to expand
  if (start == std::string::npos) {
    return;
  }
  std::string::size_type pos = 0;
  std::string expandedInput;
  while (start != std::string::npos && start < s.size() - 2) {
    std::string::size_type end = s.find('>', start);
    // if we find a < with no > we are done
    if (end == std::string::npos) {
      return;
    }
    char c = s[start + 1];
    // if the next char after the < is not A-Za-z then
    // skip it and try to find the next < in the string
    if (!isalpha(c)) {
      start = s.find('<', start + 1);
    } else {
      // extract the var
      std::string var = s.substr(start + 1, end - start - 1);
      std::string replace =
        this->ExpandRuleVariable(outputConverter, var, replaceValues);
      expandedInput += s.substr(pos, start - pos);
      expandedInput += replace;
      // move to next one
      start = s.find('<', start + var.size() + 2);
      pos = end + 1;
    }
  }
  // add the rest of the input
  expandedInput += s.substr(pos, s.size() - pos);
  s = expandedInput;
}